

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O0

void __thiscall
notch::core::ActivationLayer::ActivationLayer(ActivationLayer *this,size_t n,Activation *af)

{
  Activation *af_local;
  size_t n_local;
  ActivationLayer *this_local;
  
  ABackpropLayer::ABackpropLayer(&this->super_ABackpropLayer);
  (this->super_ABackpropLayer)._vptr_ABackpropLayer = (_func_int **)&PTR_tag_abi_cxx11__001958c8;
  this->nSize = n;
  this->activationFunction = af;
  std::valarray<float>::valarray(&this->activationGrad,n);
  std::valarray<float>::valarray(&this->propagatedErrors,n);
  return;
}

Assistant:

ActivationLayer(size_t n, const Activation &af)
        : nSize(n), activationFunction(&af),
          activationGrad(n), propagatedErrors(n) {}